

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_constants_sha(uint32_t prefix,size_t iter,uchar *expected32)

{
  int iVar1;
  void *in_RDX;
  ulong in_RSI;
  secp256k1_sha256 gen;
  secp256k1_scratch_space *scratch;
  size_t i;
  uchar inp [6];
  uchar b32 [32];
  secp256k1_sha256 acc;
  secp256k1_scalar x;
  secp256k1_scratch *in_stack_00000440;
  secp256k1_scalar *in_stack_00000448;
  secp256k1_sha256 *in_stack_00000450;
  uint32_t in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  secp256k1_context *in_stack_fffffffffffffec0;
  secp256k1_scalar *in_stack_fffffffffffffec8;
  secp256k1_sha256 *in_stack_fffffffffffffed0;
  ulong local_d8;
  undefined1 local_c8 [40];
  secp256k1_sha256 local_a0;
  void *local_18;
  ulong local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  secp256k1_scratch_space_create
            (in_stack_fffffffffffffec0,CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)
            );
  secp256k1_sha256_initialize(&local_a0);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  test_ecmult_accumulate(in_stack_00000450,in_stack_00000448,in_stack_00000440);
  secp256k1_scalar_set_int((secp256k1_scalar *)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
  test_ecmult_accumulate(in_stack_00000450,in_stack_00000448,in_stack_00000440);
  secp256k1_scalar_negate((secp256k1_scalar *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  test_ecmult_accumulate(in_stack_00000450,in_stack_00000448,in_stack_00000440);
  for (local_d8 = 0; local_d8 < local_10; local_d8 = local_d8 + 1) {
    secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffeb8);
    secp256k1_sha256_write
              (in_stack_fffffffffffffed0,(uchar *)in_stack_fffffffffffffec8,
               (size_t)in_stack_fffffffffffffec0);
    secp256k1_sha256_finalize(in_stack_fffffffffffffed0,(uchar *)in_stack_fffffffffffffec8);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)in_stack_fffffffffffffed0,(uchar *)in_stack_fffffffffffffec8,
               (int *)in_stack_fffffffffffffec0);
    test_ecmult_accumulate(in_stack_00000450,in_stack_00000448,in_stack_00000440);
  }
  secp256k1_sha256_finalize(in_stack_fffffffffffffed0,(uchar *)in_stack_fffffffffffffec8);
  iVar1 = secp256k1_memcmp_var(local_c8,local_18,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1588,"test condition failed: secp256k1_memcmp_var(b32, expected32, 32) == 0");
    abort();
  }
  secp256k1_scratch_space_destroy
            (in_stack_fffffffffffffec0,
             (secp256k1_scratch_space *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  return;
}

Assistant:

static void test_ecmult_constants_sha(uint32_t prefix, size_t iter, const unsigned char* expected32) {
    /* Using test_ecmult_accumulate, test ecmult for:
     * - Key 0
     * - Key 1
     * - Key -1
     * - For i in range(iter):
     *   - Key SHA256(LE32(prefix) || LE16(i))
     */
    secp256k1_scalar x;
    secp256k1_sha256 acc;
    unsigned char b32[32];
    unsigned char inp[6];
    size_t i;
    secp256k1_scratch_space *scratch = secp256k1_scratch_space_create(CTX, 65536);

    inp[0] = prefix & 0xFF;
    inp[1] = (prefix >> 8) & 0xFF;
    inp[2] = (prefix >> 16) & 0xFF;
    inp[3] = (prefix >> 24) & 0xFF;
    secp256k1_sha256_initialize(&acc);
    secp256k1_scalar_set_int(&x, 0);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_set_int(&x, 1);
    test_ecmult_accumulate(&acc, &x, scratch);
    secp256k1_scalar_negate(&x, &x);
    test_ecmult_accumulate(&acc, &x, scratch);

    for (i = 0; i < iter; ++i) {
        secp256k1_sha256 gen;
        inp[4] = i & 0xff;
        inp[5] = (i >> 8) & 0xff;
        secp256k1_sha256_initialize(&gen);
        secp256k1_sha256_write(&gen, inp, sizeof(inp));
        secp256k1_sha256_finalize(&gen, b32);
        secp256k1_scalar_set_b32(&x, b32, NULL);
        test_ecmult_accumulate(&acc, &x, scratch);
    }
    secp256k1_sha256_finalize(&acc, b32);
    CHECK(secp256k1_memcmp_var(b32, expected32, 32) == 0);

    secp256k1_scratch_space_destroy(CTX, scratch);
}